

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCBoolean.cpp
# Opt level: O0

bool Assimp::IFC::IntersectsBoundaryProfile
               (IfcVector3 *e0,IfcVector3 *e1,
               vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *boundary,
               bool isStartAssumedInside,
               vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
               *intersect_results,bool halfOpen)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  double *pdVar5;
  reference pvVar6;
  aiVector3t<double> *__return_storage_ptr__;
  double dVar7;
  double extraout_XMM0_Qa;
  double dVar8;
  double dVar9;
  double dVar10;
  double f;
  pair<unsigned_long,_aiVector3t<double>_> local_360;
  aiVector2t<double> local_340;
  undefined1 local_330 [8];
  IfcVector3 diff_1;
  aiVector2t<double> local_2f8;
  undefined1 local_2e8 [8];
  IfcVector3 diff;
  undefined1 local_2c8 [7];
  bool isGoingInside;
  undefined1 local_2b0 [8];
  IfcVector3 inside_dir;
  aiVector3t<double> local_280;
  double local_268;
  double local_260;
  aiVector3t<double> local_258;
  undefined1 local_240 [8];
  IfcVector3 closestPosToE1OnBoundary;
  IfcFloat et1;
  aiVector3t<double> local_208;
  double local_1f0;
  double local_1e8;
  aiVector3t<double> local_1e0;
  undefined1 local_1c8 [8];
  IfcVector3 closestPosToE0OnBoundary;
  IfcFloat et0;
  undefined1 local_1a0 [6];
  bool endsAtSegment;
  bool startsAtSegment;
  aiVector3t<double> local_190;
  aiVector3t<double> local_178;
  undefined1 local_160 [8];
  IfcVector3 check;
  undefined1 local_130 [8];
  IfcVector3 p;
  IfcFloat t;
  IfcFloat s;
  IfcFloat y;
  IfcFloat x;
  IfcFloat b_sqlen_inv;
  IfcFloat det;
  IfcVector3 b;
  IfcVector3 *b1;
  IfcVector3 *b0;
  size_t bcount_1;
  size_t i_1;
  IfcVector3 e;
  IfcVector3 b1_side;
  IfcVector3 b12;
  IfcVector3 b01;
  size_t bcount;
  size_t i;
  IfcFloat windingOrder;
  bool halfOpen_local;
  vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
  *intersect_results_local;
  bool isStartAssumedInside_local;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *boundary_local;
  IfcVector3 *e1_local;
  IfcVector3 *e0_local;
  
  bVar1 = std::
          vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
          ::empty(intersect_results);
  if (!bVar1) {
    __assert_fail("intersect_results.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCBoolean.cpp"
                  ,0xfb,
                  "bool Assimp::IFC::IntersectsBoundaryProfile(const IfcVector3 &, const IfcVector3 &, const std::vector<IfcVector3> &, const bool, std::vector<std::pair<size_t, IfcVector3>> &, const bool)"
                 );
  }
  i = 0;
  bcount = 0;
  sVar2 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size(boundary);
  for (; bcount < sVar2; bcount = bcount + 1) {
    pvVar3 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                       (boundary,(bcount + 1) % sVar2);
    pvVar4 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                       (boundary,bcount);
    ::operator-((aiVector3t<double> *)&b12.z,pvVar3,pvVar4);
    pvVar3 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                       (boundary,(bcount + 2) % sVar2);
    pvVar4 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                       (boundary,(bcount + 1) % sVar2);
    ::operator-((aiVector3t<double> *)&b1_side.z,pvVar3,pvVar4);
    aiVector3t<double>::aiVector3t((aiVector3t<double> *)&e.z,b01.x,-b12.z,0.0);
    i = (size_t)(e.z * b1_side.z + b1_side.x * b12.x + (double)i);
  }
  ::operator-((aiVector3t<double> *)&i_1,e1,e0);
  bcount_1 = 0;
  sVar2 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size(boundary);
  do {
    if (sVar2 <= bcount_1) {
      bVar1 = std::
              vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
              ::empty(intersect_results);
      return (bool)((bVar1 ^ 0xffU) & 1);
    }
    pvVar3 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                       (boundary,bcount_1);
    b.z = (double)std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                            (boundary,(bcount_1 + 1) % sVar2);
    __return_storage_ptr__ = (aiVector3t<double> *)&det;
    ::operator-(__return_storage_ptr__,(aiVector3t<double> *)b.z,pvVar3);
    dVar7 = -det * e.x + (double)i_1 * b.x;
    std::abs((int)__return_storage_ptr__);
    if (1e-06 <= extraout_XMM0_Qa) {
      dVar8 = aiVector3t<double>::SquareLength((aiVector3t<double> *)&det);
      dVar8 = 1.0 / dVar8;
      dVar9 = pvVar3->x - e0->x;
      dVar10 = pvVar3->y - e0->y;
      f = (dVar9 * e.x + -((double)i_1 * dVar10)) / dVar7;
      p.z = (dVar9 * b.x + -(det * dVar10)) / dVar7;
      ::operator*((aiVector3t<double> *)&check.z,(aiVector3t<double> *)&i_1,p.z);
      ::operator+((aiVector3t<double> *)local_130,e0,(aiVector3t<double> *)&check.z);
      ::operator*(&local_190,(aiVector3t<double> *)&det,f);
      ::operator+(&local_178,pvVar3,&local_190);
      ::operator-((aiVector3t<double> *)local_160,&local_178,(aiVector3t<double> *)local_130);
      aiVector2t<double>::aiVector2t((aiVector2t<double> *)local_1a0,(double)local_160,check.x);
      dVar7 = aiVector2t<double>::SquareLength((aiVector2t<double> *)local_1a0);
      if (1e-05 <= dVar7) {
        __assert_fail("(IfcVector2(check.x, check.y)).SquareLength() < 1e-5",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCBoolean.cpp"
                      ,0x122,
                      "bool Assimp::IFC::IntersectsBoundaryProfile(const IfcVector3 &, const IfcVector3 &, const std::vector<IfcVector3> &, const bool, std::vector<std::pair<size_t, IfcVector3>> &, const bool)"
                     );
      }
      closestPosToE0OnBoundary.z = (det * (e0->x - pvVar3->x) + b.x * (e0->y - pvVar3->y)) * dVar8;
      local_1e8 = 0.0;
      local_1f0 = 1.0;
      pdVar5 = std::min<double>(&local_1f0,&closestPosToE0OnBoundary.z);
      pdVar5 = std::max<double>(&local_1e8,pdVar5);
      ::operator*(&local_1e0,*pdVar5,(aiVector3t<double> *)&det);
      ::operator+((aiVector3t<double> *)local_1c8,pvVar3,&local_1e0);
      aiVector3t<double>::aiVector3t((aiVector3t<double> *)&et1,e0->x,e0->y,0.0);
      ::operator-(&local_208,(aiVector3t<double> *)local_1c8,(aiVector3t<double> *)&et1);
      dVar7 = aiVector3t<double>::SquareLength(&local_208);
      closestPosToE1OnBoundary.z = (det * (e1->x - pvVar3->x) + b.x * (e1->y - pvVar3->y)) * dVar8;
      local_260 = 0.0;
      local_268 = 1.0;
      pdVar5 = std::min<double>(&local_268,&closestPosToE1OnBoundary.z);
      pdVar5 = std::max<double>(&local_260,pdVar5);
      ::operator*(&local_258,*pdVar5,(aiVector3t<double> *)&det);
      ::operator+((aiVector3t<double> *)local_240,pvVar3,&local_258);
      aiVector3t<double>::aiVector3t((aiVector3t<double> *)&inside_dir.z,e1->x,e1->y,0.0);
      ::operator-(&local_280,(aiVector3t<double> *)local_240,(aiVector3t<double> *)&inside_dir.z);
      dVar9 = aiVector3t<double>::SquareLength(&local_280);
      if ((1e-12 <= dVar9) || (halfOpen)) {
        if (1e-12 <= dVar7) {
          if ((((dVar8 * -1e-06 <= f) && (f <= dVar8 * 1e-06 + 1.0)) && (0.0 <= p.z)) &&
             ((p.z <= 1.0 || (halfOpen)))) {
            bVar1 = std::
                    vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                    ::empty(intersect_results);
            if ((!bVar1) &&
               (pvVar6 = std::
                         vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                         ::back(intersect_results), pvVar6->first == bcount_1 - 1)) {
              pvVar6 = std::
                       vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                       ::back(intersect_results);
              ::operator-((aiVector3t<double> *)local_330,&pvVar6->second,
                          (aiVector3t<double> *)local_130);
              aiVector2t<double>::aiVector2t(&local_340,(double)local_330,diff_1.x);
              dVar7 = aiVector2t<double>::SquareLength(&local_340);
              if (dVar7 < 1e-10) goto LAB_0096e8fa;
            }
            std::make_pair<unsigned_long&,aiVector3t<double>const&>
                      (&local_360,&bcount_1,(aiVector3t<double> *)local_130);
            std::
            vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
            ::push_back(intersect_results,&local_360);
          }
        }
        else {
          aiVector3t<double>::aiVector3t((aiVector3t<double> *)local_2c8,b.x,-det,0.0);
          ::operator*((aiVector3t<double> *)local_2b0,(aiVector3t<double> *)local_2c8,
                      (double)(~-(ulong)(0.0 < (double)i) & 0xbff0000000000000 |
                              -(ulong)(0.0 < (double)i) & 0x3ff0000000000000));
          dVar7 = ::operator*((aiVector3t<double> *)local_2b0,(aiVector3t<double> *)&i_1);
          diff.z._7_1_ = 0.0 < dVar7;
          if ((bool)diff.z._7_1_ != isStartAssumedInside) {
            bVar1 = std::
                    vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                    ::empty(intersect_results);
            if ((!bVar1) &&
               (pvVar6 = std::
                         vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                         ::back(intersect_results), pvVar6->first == bcount_1 - 1)) {
              pvVar6 = std::
                       vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                       ::back(intersect_results);
              ::operator-((aiVector3t<double> *)local_2e8,&pvVar6->second,e0);
              aiVector2t<double>::aiVector2t(&local_2f8,(double)local_2e8,diff.x);
              dVar7 = aiVector2t<double>::SquareLength(&local_2f8);
              if (dVar7 < 1e-10) goto LAB_0096e8fa;
            }
            std::make_pair<unsigned_long&,aiVector3t<double>const&>
                      ((pair<unsigned_long,_aiVector3t<double>_> *)&diff_1.z,&bcount_1,e0);
            std::
            vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
            ::push_back(intersect_results,(value_type *)&diff_1.z);
          }
        }
      }
    }
LAB_0096e8fa:
    bcount_1 = bcount_1 + 1;
  } while( true );
}

Assistant:

bool IntersectsBoundaryProfile(const IfcVector3& e0, const IfcVector3& e1, const std::vector<IfcVector3>& boundary,
    const bool isStartAssumedInside, std::vector<std::pair<size_t, IfcVector3> >& intersect_results,
    const bool halfOpen = false)
{
    ai_assert(intersect_results.empty());

    // determine winding order - necessary to detect segments going "inwards" or "outwards" from a point directly on the border
    // positive sum of angles means clockwise order when looking down the -Z axis
    IfcFloat windingOrder = 0.0;
    for( size_t i = 0, bcount = boundary.size(); i < bcount; ++i ) {
        IfcVector3 b01 = boundary[(i + 1) % bcount] - boundary[i];
        IfcVector3 b12 = boundary[(i + 2) % bcount] - boundary[(i + 1) % bcount];
        IfcVector3 b1_side = IfcVector3(b01.y, -b01.x, 0.0); // rotated 90° clockwise in Z plane
        // Warning: rough estimate only. A concave poly with lots of small segments each featuring a small counter rotation
        // could fool the accumulation. Correct implementation would be sum( acos( b01 * b2) * sign( b12 * b1_side))
        windingOrder += (b1_side.x*b12.x + b1_side.y*b12.y);
    }
    windingOrder = windingOrder > 0.0 ? 1.0 : -1.0;

    const IfcVector3 e = e1 - e0;

    for( size_t i = 0, bcount = boundary.size(); i < bcount; ++i ) {
        // boundary segment i: b0-b1
        const IfcVector3& b0 = boundary[i];
        const IfcVector3& b1 = boundary[(i + 1) % bcount];
        IfcVector3 b = b1 - b0;

        // segment-segment intersection
        // solve b0 + b*s = e0 + e*t for (s,t)
        const IfcFloat det = (-b.x * e.y + e.x * b.y);
        if( std::abs(det) < 1e-6 ) {
            // no solutions (parallel lines)
            continue;
        }
        IfcFloat b_sqlen_inv = 1.0 / b.SquareLength();

        const IfcFloat x = b0.x - e0.x;
        const IfcFloat y = b0.y - e0.y;
        const IfcFloat s = (x*e.y - e.x*y) / det; // scale along boundary edge
        const IfcFloat t = (x*b.y - b.x*y) / det; // scale along given segment
        const IfcVector3 p = e0 + e*t;
#ifdef ASSIMP_BUILD_DEBUG
        const IfcVector3 check = b0 + b*s - p;
        ai_assert((IfcVector2(check.x, check.y)).SquareLength() < 1e-5);
#endif

        // also calculate the distance of e0 and e1 to the segment. We need to detect the "starts directly on segment"
        // and "ends directly at segment" cases
        bool startsAtSegment, endsAtSegment;
        {
            // calculate closest point to each end on the segment, clamp that point to the segment's length, then check
            // distance to that point. This approach is like testing if e0 is inside a capped cylinder.
            IfcFloat et0 = (b.x*(e0.x - b0.x) + b.y*(e0.y - b0.y)) * b_sqlen_inv;
            IfcVector3 closestPosToE0OnBoundary = b0 + std::max(IfcFloat(0.0), std::min(IfcFloat(1.0), et0)) * b;
            startsAtSegment = (closestPosToE0OnBoundary - IfcVector3(e0.x, e0.y, 0.0)).SquareLength() < 1e-12;
            IfcFloat et1 = (b.x*(e1.x - b0.x) + b.y*(e1.y - b0.y)) * b_sqlen_inv;
            IfcVector3 closestPosToE1OnBoundary = b0 + std::max(IfcFloat(0.0), std::min(IfcFloat(1.0), et1)) * b;
            endsAtSegment = (closestPosToE1OnBoundary - IfcVector3(e1.x, e1.y, 0.0)).SquareLength() < 1e-12;
        }

        // Line segment ends at boundary -> ignore any hit, it will be handled by possibly following segments
        if( endsAtSegment && !halfOpen )
            continue;

        // Line segment starts at boundary -> generate a hit only if following that line would change the INSIDE/OUTSIDE
        // state. This should catch the case where a connected set of segments has a point directly on the boundary,
        // one segment not hitting it because it ends there and the next segment not hitting it because it starts there
        // Should NOT generate a hit if the segment only touches the boundary but turns around and stays inside.
        if( startsAtSegment )
        {
            IfcVector3 inside_dir = IfcVector3(b.y, -b.x, 0.0) * windingOrder;
            bool isGoingInside = (inside_dir * e) > 0.0;
            if( isGoingInside == isStartAssumedInside )
                continue;

            // only insert the point into the list if it is sufficiently far away from the previous intersection point.
            // This way, we avoid duplicate detection if the intersection is directly on the vertex between two segments.
            if( !intersect_results.empty() && intersect_results.back().first == i - 1 )
            {
                const IfcVector3 diff = intersect_results.back().second - e0;
                if( IfcVector2(diff.x, diff.y).SquareLength() < 1e-10 )
                    continue;
            }
            intersect_results.push_back(std::make_pair(i, e0));
            continue;
        }

        // for a valid intersection, s and t should be in range [0,1]. Including a bit of epsilon on s, potential double
        // hits on two consecutive boundary segments are filtered
        if( s >= -1e-6 * b_sqlen_inv && s <= 1.0 + 1e-6*b_sqlen_inv && t >= 0.0 && (t <= 1.0 || halfOpen) )
        {
            // only insert the point into the list if it is sufficiently far away from the previous intersection point.
            // This way, we avoid duplicate detection if the intersection is directly on the vertex between two segments.
            if( !intersect_results.empty() && intersect_results.back().first == i - 1 )
            {
                const IfcVector3 diff = intersect_results.back().second - p;
                if( IfcVector2(diff.x, diff.y).SquareLength() < 1e-10 )
                    continue;
            }
            intersect_results.push_back(std::make_pair(i, p));
        }
    }

    return !intersect_results.empty();
}